

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary.cpp
# Opt level: O1

bool __thiscall Arbitraryforward_list::Run(Arbitraryforward_list *this)

{
  _Fwd_list_node_base *p_Var1;
  _Fwd_list_impl _Var2;
  long *plVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  forward_list<int,_std::allocator<int>_> v;
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  vv;
  _Fwd_list_impl in_stack_ffffffffffffffb8;
  _Fwd_list_node_base *in_stack_ffffffffffffffc0;
  _Fwd_list_node_base *local_38;
  
  plVar3 = (long *)&stack0xffffffffffffffb8;
  testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::generate
            ((size_t)in_stack_ffffffffffffffc0,
             (unsigned_long)in_stack_ffffffffffffffb8._M_head._M_next);
  testinator::Arbitrary<std::forward_list<int,_std::allocator<int>_>_>::shrink
            ((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
              *)&stack0xffffffffffffffc0,(output_type *)&stack0xffffffffffffffb8);
  lVar5 = -1;
  do {
    plVar3 = (long *)*plVar3;
    lVar5 = lVar5 + 1;
  } while (plVar3 != (long *)0x0);
  if (local_38 == in_stack_ffffffffffffffc0) {
    lVar6 = 0;
  }
  else {
    lVar6 = -1;
    _Var2._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)in_stack_ffffffffffffffc0;
    do {
      _Var2._M_head._M_next =
           (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var2._M_head._M_next)->_M_next;
      lVar6 = lVar6 + 1;
    } while ((_Fwd_list_impl)_Var2._M_head._M_next != (_Fwd_list_impl)0x0);
  }
  if ((ulong)((long)local_38 - (long)in_stack_ffffffffffffffc0) < 9) {
    lVar4 = 0;
  }
  else {
    p_Var1 = in_stack_ffffffffffffffc0 + 1;
    lVar4 = -1;
    do {
      p_Var1 = p_Var1->_M_next;
      lVar4 = lVar4 + 1;
    } while (p_Var1 != (_Fwd_list_node_base *)0x0);
  }
  std::
  vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::forward_list<int,_std::allocator<int>_>,_std::allocator<std::forward_list<int,_std::allocator<int>_>_>_>
             *)&stack0xffffffffffffffc0);
  while (in_stack_ffffffffffffffb8._M_head._M_next != (_Fwd_list_node_base *)0x0) {
    p_Var1 = ((_Fwd_list_node_base *)in_stack_ffffffffffffffb8._M_head._M_next)->_M_next;
    operator_delete((void *)in_stack_ffffffffffffffb8._M_head._M_next,0x10);
    in_stack_ffffffffffffffb8._M_head._M_next = (_Fwd_list_node_base)(_Fwd_list_node_base)p_Var1;
  }
  return lVar4 + lVar6 == lVar5 && (long)local_38 - (long)in_stack_ffffffffffffffc0 == 0x10;
}

Assistant:

DEF_TEST(forward_list, Arbitrary)
{
  testinator::Arbitrary<forward_list<int>> a;
  forward_list<int> v = a.generate(1,0);
  vector<forward_list<int>> vv = a.shrink(v);

  std::size_t vlen = 0;
  for (auto it = v.begin(); it != v.end(); ++it, ++vlen);

  std::size_t vv0len = 0;
  std::size_t vv1len = 0;
  if (vv.size() > 0)
    for (auto it = vv[0].begin(); it != vv[0].end(); ++it, ++vv0len);
  if (vv.size() > 1)
    for (auto it = vv[1].begin(); it != vv[1].end(); ++it, ++vv1len);

  return vv.size() == 2
    && vv0len + vv1len == vlen;
}